

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t avx2_despace_branchless(char *bytes,size_t howmany)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m256i carriage_00;
  __m256i newline_00;
  __m256i spaces_00;
  __m256i x_00;
  undefined8 *puVar4;
  undefined8 *in_RCX;
  long in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  longlong in_R8;
  longlong in_R9;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  __m128i spaces_01;
  __m128i newline_01;
  __m128i alVar9;
  char c;
  int mask16;
  __m128i x_1;
  int offset2;
  int offset1;
  uint maskhigh;
  uint masklow;
  __m256i x;
  size_t i;
  __m256i carriage256;
  __m256i newline256;
  __m256i spaces256;
  __m128i carriage;
  __m128i newline;
  __m128i spaces;
  size_t pos;
  __m128i in_stack_fffffffffffffc80;
  undefined5 in_stack_fffffffffffffc90;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined4 local_364;
  undefined8 local_360;
  undefined8 uStack_358;
  int local_350;
  int local_34c;
  undefined4 local_348;
  undefined4 local_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined4 *local_308;
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  longlong in_stack_fffffffffffffd90;
  size_t sVar13;
  undefined4 *puVar14;
  undefined5 in_stack_fffffffffffffdb0;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  longlong in_stack_fffffffffffffdd0;
  undefined8 local_210;
  undefined8 uStack_208;
  longlong local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_120;
  uint *puStack_118;
  uint *puStack_110;
  undefined8 uStack_108;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  sVar13 = 0;
  uVar17 = 0x20;
  uVar10 = 0x20;
  auVar2 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar2 = vpinsrb_avx(auVar2,0x20,2);
  auVar2 = vpinsrb_avx(auVar2,0x20,3);
  auVar2 = vpinsrb_avx(auVar2,0x20,4);
  auVar2 = vpinsrb_avx(auVar2,0x20,5);
  auVar2 = vpinsrb_avx(auVar2,0x20,6);
  auVar2 = vpinsrb_avx(auVar2,0x20,7);
  auVar2 = vpinsrb_avx(auVar2,0x20,8);
  auVar2 = vpinsrb_avx(auVar2,0x20,9);
  auVar2 = vpinsrb_avx(auVar2,0x20,10);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xf);
  local_210 = auVar2._0_8_;
  uStack_208 = auVar2._8_8_;
  uVar16 = 10;
  uVar11 = 10;
  auVar2 = vpinsrb_avx(ZEXT116(10),10,1);
  auVar2 = vpinsrb_avx(auVar2,10,2);
  auVar2 = vpinsrb_avx(auVar2,10,3);
  auVar2 = vpinsrb_avx(auVar2,10,4);
  auVar2 = vpinsrb_avx(auVar2,10,5);
  auVar2 = vpinsrb_avx(auVar2,10,6);
  auVar2 = vpinsrb_avx(auVar2,10,7);
  auVar2 = vpinsrb_avx(auVar2,10,8);
  auVar2 = vpinsrb_avx(auVar2,10,9);
  auVar2 = vpinsrb_avx(auVar2,10,10);
  auVar2 = vpinsrb_avx(auVar2,10,0xb);
  auVar2 = vpinsrb_avx(auVar2,10,0xc);
  auVar2 = vpinsrb_avx(auVar2,10,0xd);
  auVar2 = vpinsrb_avx(auVar2,10,0xe);
  auVar2 = vpinsrb_avx(auVar2,10,0xf);
  local_1f0 = auVar2._0_8_;
  uStack_1e8 = auVar2._8_8_;
  uVar15 = 0xd;
  uVar12 = 0xd;
  auVar2 = vpinsrb_avx(ZEXT116(0xd),0xd,1);
  auVar2 = vpinsrb_avx(auVar2,0xd,2);
  auVar2 = vpinsrb_avx(auVar2,0xd,3);
  auVar2 = vpinsrb_avx(auVar2,0xd,4);
  auVar2 = vpinsrb_avx(auVar2,0xd,5);
  auVar2 = vpinsrb_avx(auVar2,0xd,6);
  auVar2 = vpinsrb_avx(auVar2,0xd,7);
  auVar2 = vpinsrb_avx(auVar2,0xd,8);
  auVar2 = vpinsrb_avx(auVar2,0xd,9);
  auVar2 = vpinsrb_avx(auVar2,0xd,10);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xb);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xd);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xe);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xf);
  local_1d0 = auVar2._0_8_;
  uStack_1c8 = auVar2._8_8_;
  auVar2 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar2 = vpinsrb_avx(auVar2,0x20,2);
  auVar2 = vpinsrb_avx(auVar2,0x20,3);
  auVar2 = vpinsrb_avx(auVar2,0x20,4);
  auVar2 = vpinsrb_avx(auVar2,0x20,5);
  auVar2 = vpinsrb_avx(auVar2,0x20,6);
  auVar2 = vpinsrb_avx(auVar2,0x20,7);
  auVar2 = vpinsrb_avx(auVar2,0x20,8);
  auVar2 = vpinsrb_avx(auVar2,0x20,9);
  auVar2 = vpinsrb_avx(auVar2,0x20,10);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar3 = vpinsrb_avx(auVar3,0x20,2);
  auVar3 = vpinsrb_avx(auVar3,0x20,3);
  auVar3 = vpinsrb_avx(auVar3,0x20,4);
  auVar3 = vpinsrb_avx(auVar3,0x20,5);
  auVar3 = vpinsrb_avx(auVar3,0x20,6);
  auVar3 = vpinsrb_avx(auVar3,0x20,7);
  auVar3 = vpinsrb_avx(auVar3,0x20,8);
  auVar3 = vpinsrb_avx(auVar3,0x20,9);
  auVar3 = vpinsrb_avx(auVar3,0x20,10);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xb);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xc);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xd);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xe);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xf);
  local_120 = auVar2._0_8_;
  puStack_118 = auVar2._8_8_;
  puStack_110 = auVar3._0_8_;
  uStack_108 = auVar3._8_8_;
  local_2c0 = local_120;
  auVar2 = vpinsrb_avx(ZEXT116(10),10,1);
  auVar2 = vpinsrb_avx(auVar2,10,2);
  auVar2 = vpinsrb_avx(auVar2,10,3);
  auVar2 = vpinsrb_avx(auVar2,10,4);
  auVar2 = vpinsrb_avx(auVar2,10,5);
  auVar2 = vpinsrb_avx(auVar2,10,6);
  auVar2 = vpinsrb_avx(auVar2,10,7);
  auVar2 = vpinsrb_avx(auVar2,10,8);
  auVar2 = vpinsrb_avx(auVar2,10,9);
  auVar2 = vpinsrb_avx(auVar2,10,10);
  auVar2 = vpinsrb_avx(auVar2,10,0xb);
  auVar2 = vpinsrb_avx(auVar2,10,0xc);
  auVar2 = vpinsrb_avx(auVar2,10,0xd);
  auVar2 = vpinsrb_avx(auVar2,10,0xe);
  auVar2 = vpinsrb_avx(auVar2,10,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(10),10,1);
  auVar3 = vpinsrb_avx(auVar3,10,2);
  auVar3 = vpinsrb_avx(auVar3,10,3);
  auVar3 = vpinsrb_avx(auVar3,10,4);
  auVar3 = vpinsrb_avx(auVar3,10,5);
  auVar3 = vpinsrb_avx(auVar3,10,6);
  auVar3 = vpinsrb_avx(auVar3,10,7);
  auVar3 = vpinsrb_avx(auVar3,10,8);
  auVar3 = vpinsrb_avx(auVar3,10,9);
  auVar3 = vpinsrb_avx(auVar3,10,10);
  auVar3 = vpinsrb_avx(auVar3,10,0xb);
  auVar3 = vpinsrb_avx(auVar3,10,0xc);
  auVar3 = vpinsrb_avx(auVar3,10,0xd);
  auVar3 = vpinsrb_avx(auVar3,10,0xe);
  auVar3 = vpinsrb_avx(auVar3,10,0xf);
  local_e0 = auVar2._0_8_;
  uStack_d8 = auVar2._8_8_;
  uStack_d0 = auVar3._0_8_;
  uStack_c8 = auVar3._8_8_;
  local_2e0 = local_e0;
  uStack_2d8 = uStack_d8;
  uStack_2d0 = uStack_d0;
  uStack_2c8 = uStack_c8;
  auVar2 = vpinsrb_avx(ZEXT116(0xd),0xd,1);
  auVar2 = vpinsrb_avx(auVar2,0xd,2);
  auVar2 = vpinsrb_avx(auVar2,0xd,3);
  auVar2 = vpinsrb_avx(auVar2,0xd,4);
  auVar2 = vpinsrb_avx(auVar2,0xd,5);
  auVar2 = vpinsrb_avx(auVar2,0xd,6);
  auVar2 = vpinsrb_avx(auVar2,0xd,7);
  auVar2 = vpinsrb_avx(auVar2,0xd,8);
  auVar2 = vpinsrb_avx(auVar2,0xd,9);
  auVar2 = vpinsrb_avx(auVar2,0xd,10);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xb);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xd);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xe);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(0xd),0xd,1);
  auVar3 = vpinsrb_avx(auVar3,0xd,2);
  auVar3 = vpinsrb_avx(auVar3,0xd,3);
  auVar3 = vpinsrb_avx(auVar3,0xd,4);
  auVar3 = vpinsrb_avx(auVar3,0xd,5);
  auVar3 = vpinsrb_avx(auVar3,0xd,6);
  auVar3 = vpinsrb_avx(auVar3,0xd,7);
  auVar3 = vpinsrb_avx(auVar3,0xd,8);
  auVar3 = vpinsrb_avx(auVar3,0xd,9);
  auVar3 = vpinsrb_avx(auVar3,0xd,10);
  auVar3 = vpinsrb_avx(auVar3,0xd,0xb);
  auVar3 = vpinsrb_avx(auVar3,0xd,0xc);
  auVar3 = vpinsrb_avx(auVar3,0xd,0xd);
  auVar3 = vpinsrb_avx(auVar3,0xd,0xe);
  auVar3 = vpinsrb_avx(auVar3,0xd,0xf);
  local_300 = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auStack_2f0 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  puVar14 = in_RSI;
  for (local_308 = (undefined4 *)0x0; (undefined4 *)((long)local_308 + 0x1fU) < puVar14;
      local_308 = local_308 + 8) {
    puVar4 = (undefined8 *)(in_RDI + (long)local_308);
    uVar5 = *puVar4;
    uVar6 = puVar4[1];
    uVar7 = puVar4[2];
    uVar8 = puVar4[3];
    in_RSI = &local_348;
    x_00[1] = in_stack_fffffffffffffdc0;
    x_00[0] = in_stack_fffffffffffffdb8;
    x_00[2] = in_stack_fffffffffffffdc8;
    x_00[3] = in_stack_fffffffffffffdd0;
    spaces_00[1] = (longlong)puVar14;
    spaces_00[0] = sVar13;
    spaces_00[2] = in_RDI;
    spaces_00[3]._0_5_ = in_stack_fffffffffffffdb0;
    spaces_00[3]._5_1_ = uVar15;
    spaces_00[3]._6_1_ = uVar16;
    spaces_00[3]._7_1_ = uVar17;
    newline_00[1] = local_210;
    newline_00[0] = uStack_1e8;
    newline_00[2] = uStack_208;
    newline_00[3] = in_stack_fffffffffffffd90;
    carriage_00[1] = local_1d0;
    carriage_00[0] = uStack_108;
    carriage_00[2] = uStack_1c8;
    carriage_00[3] = local_1f0;
    local_340 = uVar5;
    uStack_338 = uVar6;
    uStack_330 = uVar7;
    uStack_328 = uVar8;
    cleanm256(x_00,spaces_00,newline_00,carriage_00,puStack_110,puStack_118);
    local_34c = 0x10 - POPCOUNT(local_344);
    local_350 = 0x10 - POPCOUNT(local_348);
    puVar4 = (undefined8 *)(in_RDI + sVar13);
    in_RDX = (long)local_34c;
    in_RCX = (undefined8 *)((long)puVar4 + in_RDX);
    *puVar4 = uVar5;
    puVar4[1] = uVar6;
    *in_RCX = uVar7;
    in_RCX[1] = uVar8;
    sVar13 = (long)(local_34c + local_350) + sVar13;
    local_340 = uVar5;
    uStack_338 = uVar6;
    uStack_330 = uVar7;
    uStack_328 = uVar8;
  }
  for (; (undefined4 *)((long)local_308 + 0xfU) < puVar14; local_308 = local_308 + 4) {
    uVar5 = *(undefined8 *)(in_RDI + (long)local_308);
    uVar6 = ((undefined8 *)(in_RDI + (long)local_308))[1];
    alVar9[1] = (longlong)in_RSI;
    alVar9[0] = (longlong)&local_364;
    spaces_01[1] = (longlong)in_RCX;
    spaces_01[0] = in_RDX;
    newline_01[1] = in_R9;
    newline_01[0] = in_R8;
    local_360 = uVar5;
    uStack_358 = uVar6;
    alVar9 = cleanm128(alVar9,spaces_01,newline_01,in_stack_fffffffffffffc80,
                       (int *)CONCAT17(uVar12,CONCAT16(uVar11,CONCAT15(uVar10,
                                                  in_stack_fffffffffffffc90))));
    in_RDX = alVar9[1];
    *(undefined8 *)(in_RDI + sVar13) = uVar5;
    ((undefined8 *)(in_RDI + sVar13))[1] = uVar6;
    in_RCX = (undefined8 *)(ulong)(uint)POPCOUNT(local_364);
    sVar13 = (long)(0x10 - POPCOUNT(local_364)) + sVar13;
  }
  for (; local_308 < puVar14; local_308 = (undefined4 *)((long)local_308 + 1)) {
    cVar1 = *(char *)(in_RDI + (long)local_308);
    if (((cVar1 != '\r') && (cVar1 != '\n')) && (cVar1 != ' ')) {
      *(char *)(in_RDI + sVar13) = cVar1;
      sVar13 = sVar13 + 1;
    }
  }
  return sVar13;
}

Assistant:

size_t avx2_despace_branchless(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i spaces = _mm_set1_epi8(' ');
  __m128i newline = _mm_set1_epi8('\n');
  __m128i carriage = _mm_set1_epi8('\r');

  __m256i spaces256 = _mm256_set1_epi8(' ');
  __m256i newline256 = _mm256_set1_epi8('\n');
  __m256i carriage256 = _mm256_set1_epi8('\r');

  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m256i x = _mm256_loadu_si256((const __m256i *)(bytes + i));
    unsigned int masklow, maskhigh;
    x = cleanm256(x, spaces256, newline256, carriage256, &masklow, &maskhigh);
    int offset1 = 16 - _mm_popcnt_u32(masklow);
    int offset2 = 16 - _mm_popcnt_u32(maskhigh);
    _mm256_storeu2_m128i((__m128i *)(bytes + pos + offset1),
                         (__m128i *)(bytes + pos), x);
    pos += offset1 + offset2;
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = cleanm128(x, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}